

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::texSubImage3D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int zoffset,
          int width,int height,int depth,deUint32 format,deUint32 type,void *data)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  reference pvVar4;
  void *data_00;
  PixelBufferAccess *pPVar5;
  TextureFormat *pTVar6;
  TextureCubeArray *local_408;
  Texture2DArray *local_3f0;
  Texture3D *local_3d8;
  TextureCube *local_3c0;
  Texture2D *local_3a8;
  Texture1D *local_390;
  PixelBufferAccess local_370;
  PixelBufferAccess local_348;
  undefined1 local_320 [8];
  PixelBufferAccess dst_5;
  TextureCubeArray *texture_5;
  PixelBufferAccess local_2c8;
  undefined1 local_2a0 [8];
  PixelBufferAccess dst_4;
  Texture2DArray *texture_4;
  PixelBufferAccess local_248;
  undefined1 local_220 [8];
  PixelBufferAccess dst_3;
  Texture3D *texture_3;
  PixelBufferAccess local_1c8;
  undefined1 local_1a0 [8];
  PixelBufferAccess dst_2;
  CubeFace face;
  TextureCube *texture_2;
  PixelBufferAccess local_140;
  undefined1 local_118 [8];
  PixelBufferAccess dst_1;
  Texture2D *texture_1;
  PixelBufferAccess local_c0;
  undefined1 local_98 [8];
  PixelBufferAccess dst;
  Texture1D *texture;
  undefined1 local_60 [8];
  ConstPixelBufferAccess src;
  TextureFormat transferFmt;
  TextureUnit *unit;
  int zoffset_local;
  int yoffset_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  pvVar4 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  do {
    if (((xoffset < 0) || (yoffset < 0)) || (zoffset < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if (((width < 0) || (height < 0)) || (depth < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  src.m_data = (void *)glu::mapGLTransferFormat(format,type);
  do {
    if (((int)src.m_data == 0x15) || (src.m_data._4_4_ == 0x26)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  data_00 = getPixelUnpackPtr(this,data);
  getUnpack3DAccess((ConstPixelBufferAccess *)local_60,this,(TextureFormat *)&src.m_data,width,
                    height,depth,data_00);
  if ((target == 0xde0) &&
     (bVar1 = glu::isContextTypeGLCore
                        ((ContextType)(this->m_limits).contextType.super_ApiType.m_bits), bVar1)) {
    if (pvVar4->tex1DBinding == (Texture1D *)0x0) {
      local_390 = &pvVar4->default1DTex;
    }
    else {
      local_390 = pvVar4->tex1DBinding;
    }
    dst.super_ConstPixelBufferAccess.m_data = local_390;
    do {
      bVar1 = rc::Texture1D::hasLevel((Texture1D *)dst.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::Texture1D::getLevel((Texture1D *)dst.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_98,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_98);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_98),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_98),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_98);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_98),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_c0,(PixelBufferAccess *)local_98,xoffset,yoffset,zoffset,width,height
                        ,depth);
      depthValueFloatClampCopy(&local_c0,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion((PixelBufferAccess *)&texture_1,(PixelBufferAccess *)local_98,xoffset,
                        yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&texture_1,(EVP_PKEY_CTX *)local_60);
    }
  }
  else if (target == 0xde1) {
    if (pvVar4->tex2DBinding == (Texture2D *)0x0) {
      local_3a8 = &pvVar4->default2DTex;
    }
    else {
      local_3a8 = pvVar4->tex2DBinding;
    }
    dst_1.super_ConstPixelBufferAccess.m_data = local_3a8;
    do {
      bVar1 = rc::Texture2D::hasLevel((Texture2D *)dst_1.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::Texture2D::getLevel((Texture2D *)dst_1.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_118,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_118);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_118),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_118),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_118);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_118),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_140,(PixelBufferAccess *)local_118,xoffset,yoffset,zoffset,width,
                        height,depth);
      depthValueFloatClampCopy(&local_140,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion((PixelBufferAccess *)&texture_2,(PixelBufferAccess *)local_118,xoffset,
                        yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&texture_2,(EVP_PKEY_CTX *)local_60);
    }
  }
  else if (((((target == 0x8516) || (target == 0x8515)) || (target == 0x8518)) ||
           ((target == 0x8517 || (target == 0x851a)))) || (target == 0x8519)) {
    if (pvVar4->texCubeBinding == (TextureCube *)0x0) {
      local_3c0 = &pvVar4->defaultCubeTex;
    }
    else {
      local_3c0 = pvVar4->texCubeBinding;
    }
    dst_2.super_ConstPixelBufferAccess.m_data._4_4_ = mapGLCubeFace(target);
    do {
      bVar1 = rc::TextureCube::hasFace
                        (local_3c0,level,dst_2.super_ConstPixelBufferAccess.m_data._4_4_);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::TextureCube::getFace
                       (local_3c0,level,dst_2.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1a0,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_1a0);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_1a0),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_1a0),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_1a0);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_1a0),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_1c8,(PixelBufferAccess *)local_1a0,xoffset,yoffset,zoffset,width,
                        height,depth);
      depthValueFloatClampCopy(&local_1c8,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion((PixelBufferAccess *)&texture_3,(PixelBufferAccess *)local_1a0,xoffset,
                        yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&texture_3,(EVP_PKEY_CTX *)local_60);
    }
  }
  else if (target == 0x806f) {
    if (pvVar4->tex3DBinding == (Texture3D *)0x0) {
      local_3d8 = &pvVar4->default3DTex;
    }
    else {
      local_3d8 = pvVar4->tex3DBinding;
    }
    dst_3.super_ConstPixelBufferAccess.m_data = local_3d8;
    do {
      bVar1 = rc::Texture3D::hasLevel((Texture3D *)dst_3.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::Texture3D::getLevel((Texture3D *)dst_3.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_220,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_220);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_220),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_220),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_220);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_220),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_248,(PixelBufferAccess *)local_220,xoffset,yoffset,zoffset,width,
                        height,depth);
      depthValueFloatClampCopy(&local_248,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion((PixelBufferAccess *)&texture_4,(PixelBufferAccess *)local_220,xoffset,
                        yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&texture_4,(EVP_PKEY_CTX *)local_60);
    }
  }
  else if (target == 0x8c1a) {
    if (pvVar4->tex2DArrayBinding == (Texture2DArray *)0x0) {
      local_3f0 = &pvVar4->default2DArrayTex;
    }
    else {
      local_3f0 = pvVar4->tex2DArrayBinding;
    }
    dst_4.super_ConstPixelBufferAccess.m_data = local_3f0;
    do {
      bVar1 = rc::Texture2DArray::hasLevel
                        ((Texture2DArray *)dst_4.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::Texture2DArray::getLevel
                       ((Texture2DArray *)dst_4.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_2a0,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_2a0);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_2a0),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_2a0),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_2a0);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_2a0),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_2c8,(PixelBufferAccess *)local_2a0,xoffset,yoffset,zoffset,width,
                        height,depth);
      depthValueFloatClampCopy(&local_2c8,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion((PixelBufferAccess *)&texture_5,(PixelBufferAccess *)local_2a0,xoffset,
                        yoffset,zoffset,width,height,depth);
      tcu::copy((EVP_PKEY_CTX *)&texture_5,(EVP_PKEY_CTX *)local_60);
    }
  }
  else if (target == 0x9009) {
    if (pvVar4->texCubeArrayBinding == (TextureCubeArray *)0x0) {
      local_408 = &pvVar4->defaultCubeArrayTex;
    }
    else {
      local_408 = pvVar4->texCubeArrayBinding;
    }
    dst_5.super_ConstPixelBufferAccess.m_data = local_408;
    do {
      bVar1 = rc::TextureCubeArray::hasLevel
                        ((TextureCubeArray *)dst_5.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::TextureCubeArray::getLevel
                       ((TextureCubeArray *)dst_5.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_320,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_320);
      if (((iVar3 < xoffset + width) ||
          (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_320),
          iVar3 < yoffset + height)) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_320),
         iVar3 < zoffset + depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_320);
    if ((pTVar6->order == D) ||
       (pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_320),
       pTVar6->order == DS)) {
      tcu::getSubregion(&local_348,(PixelBufferAccess *)local_320,xoffset,yoffset,zoffset,width,
                        height,depth);
      depthValueFloatClampCopy(&local_348,(ConstPixelBufferAccess *)local_60);
    }
    else {
      tcu::getSubregion(&local_370,(PixelBufferAccess *)local_320,xoffset,yoffset,zoffset,width,
                        height,depth);
      tcu::copy((EVP_PKEY_CTX *)&local_370,(EVP_PKEY_CTX *)local_60);
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::texSubImage3D (deUint32 target, int level, int xoffset, int yoffset, int zoffset, int width, int height, int depth, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit& unit = m_textureUnits[m_activeTexture];

	RC_IF_ERROR(xoffset < 0 || yoffset < 0 || zoffset < 0,	GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0,		GL_INVALID_VALUE, RC_RET_VOID);

	TextureFormat transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	ConstPixelBufferAccess src = getUnpack3DAccess(transferFmt, width, height, depth, getPixelUnpackPtr(data));

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_3D)
	{
		Texture3D& texture = unit.tex3DBinding ? *unit.tex3DBinding : unit.default3DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		Texture2DArray& texture = unit.tex2DArrayBinding ? *unit.tex2DArrayBinding : unit.default2DArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		TextureCubeArray& texture = unit.texCubeArrayBinding ? *unit.texCubeArrayBinding : unit.defaultCubeArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}